

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# our_gl.cpp
# Opt level: O1

void triangle(Model *model,array<vec<4UL,_double>,_3UL> pts,IShader *shader,TGAImage *image,
             DepthBuffer *zbuffer)

{
  int i;
  int iVar1;
  long lVar2;
  ulong uVar3;
  vec<4UL,_double> *pvVar4;
  long lVar5;
  ulong uVar6;
  ulong y;
  ulong x;
  bool bVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  double dVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  vec2f A;
  vec2f B;
  vec2f C;
  vec2f P;
  vec3f c;
  vec<4UL,_double> ret_2;
  vec<4UL,_double> ret_1;
  vec<4UL,_double> ret;
  TGAColor local_124;
  int local_11c;
  double local_118;
  double local_110;
  double local_108;
  int local_fc;
  ulong local_f8;
  ulong local_f0;
  TGAImage *local_e8;
  Model *local_e0;
  IShader *local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  vec3f local_b0;
  double local_98 [4];
  double local_78 [4];
  double local_58 [5];
  
  pvVar4 = pts._M_elems;
  uVar8 = 0xffffffff;
  uVar10 = 0xffefffff;
  dVar17 = 1.79769313486232e+308;
  lVar2 = 0;
  dVar12 = 1.79769313486232e+308;
  uVar13 = uVar8;
  uVar15 = uVar10;
  do {
    lVar5 = 0;
    uVar9 = uVar8;
    uVar11 = uVar10;
    dVar18 = dVar17;
    do {
      bVar7 = lVar5 == 0;
      dVar20 = dVar18;
      if (!bVar7) {
        dVar20 = dVar12;
      }
      dVar19 = ((vec<4UL,_double> *)pvVar4->data)->data[lVar5] / pts._M_elems[lVar2].data[3];
      dVar17 = dVar19;
      if (dVar20 <= dVar19) {
        dVar17 = dVar20;
      }
      if (bVar7) {
        dVar20 = (double)CONCAT44(uVar11,uVar9);
      }
      else {
        dVar20 = (double)CONCAT44(uVar15,uVar13);
        dVar12 = dVar17;
        dVar17 = dVar18;
      }
      if (dVar19 <= dVar20) {
        dVar19 = dVar20;
      }
      uVar14 = (undefined4)((ulong)dVar19 >> 0x20);
      uVar8 = SUB84(dVar19,0);
      uVar10 = uVar14;
      if (!bVar7) {
        uVar8 = uVar9;
        uVar10 = uVar11;
        uVar13 = SUB84(dVar19,0);
        uVar15 = uVar14;
      }
      lVar5 = lVar5 + 1;
      uVar9 = uVar8;
      uVar11 = uVar10;
      dVar18 = dVar17;
    } while (lVar5 == 1);
    lVar2 = lVar2 + 1;
    pvVar4 = pvVar4 + 1;
  } while (lVar2 != 3);
  local_124.bytespp = '\0';
  local_124.bgra[0] = '\0';
  local_124.bgra[1] = '\0';
  local_124.bgra[2] = '\0';
  local_124.bgra[3] = '\0';
  if ((int)dVar17 <= (int)(double)CONCAT44(uVar10,uVar8)) {
    local_fc = (int)dVar12;
    local_f0 = (ulong)(uint)(int)(double)CONCAT44(uVar15,uVar13);
    local_b8 = pts._M_elems[0].data[2];
    local_c0 = pts._M_elems[1].data[2];
    local_c8 = pts._M_elems[2].data[2];
    local_f8 = (ulong)local_fc;
    x = (ulong)(int)dVar17;
    local_11c = (int)(double)CONCAT44(uVar10,uVar8) + 1;
    local_108 = pts._M_elems[0].data[3];
    local_110 = pts._M_elems[1].data[3];
    local_118 = pts._M_elems[2].data[3];
    dVar12 = pts._M_elems[0].data[3];
    dVar17 = pts._M_elems[1].data[3];
    dVar18 = pts._M_elems[2].data[3];
    local_e8 = image;
    local_e0 = model;
    local_d8 = shader;
    do {
      y = local_f8;
      if (local_fc <= (int)local_f0) {
        do {
          local_58[2] = pts._M_elems[0].data[2];
          local_58[3] = pts._M_elems[0].data[3];
          local_58[0] = pts._M_elems[0].data[0];
          local_58[1] = pts._M_elems[0].data[1];
          lVar2 = 3;
          do {
            local_58[lVar2] = local_58[lVar2] / dVar12;
            bVar7 = lVar2 != 0;
            lVar2 = lVar2 + -1;
          } while (bVar7);
          dVar12 = 0.0;
          lVar2 = 8;
          uVar8 = 0;
          uVar10 = 0;
          do {
            dVar20 = *(double *)((long)local_58 + lVar2);
            uVar9 = SUB84(dVar20,0);
            uVar11 = (undefined4)((ulong)dVar20 >> 0x20);
            if (lVar2 != 0) {
              uVar9 = uVar8;
              uVar11 = uVar10;
              dVar12 = dVar20;
            }
            lVar2 = lVar2 + -8;
            uVar8 = uVar9;
            uVar10 = uVar11;
          } while (lVar2 != -8);
          local_78[2] = pts._M_elems[1].data[2];
          local_78[3] = pts._M_elems[1].data[3];
          local_78[0] = pts._M_elems[1].data[0];
          local_78[1] = pts._M_elems[1].data[1];
          lVar2 = 3;
          do {
            local_78[lVar2] = local_78[lVar2] / dVar17;
            bVar7 = lVar2 != 0;
            lVar2 = lVar2 + -1;
          } while (bVar7);
          dVar17 = 0.0;
          lVar2 = 8;
          uVar8 = 0;
          uVar10 = 0;
          do {
            dVar20 = *(double *)((long)local_78 + lVar2);
            uVar14 = SUB84(dVar20,0);
            uVar16 = (undefined4)((ulong)dVar20 >> 0x20);
            if (lVar2 != 0) {
              uVar14 = uVar8;
              uVar16 = uVar10;
              dVar17 = dVar20;
            }
            lVar2 = lVar2 + -8;
            uVar8 = uVar14;
            uVar10 = uVar16;
          } while (lVar2 != -8);
          local_98[2] = pts._M_elems[2].data[2];
          local_98[3] = pts._M_elems[2].data[3];
          local_98[0] = pts._M_elems[2].data[0];
          local_98[1] = pts._M_elems[2].data[1];
          lVar2 = 3;
          do {
            local_98[lVar2] = local_98[lVar2] / dVar18;
            bVar7 = lVar2 != 0;
            lVar2 = lVar2 + -1;
          } while (bVar7);
          lVar2 = 8;
          uVar8 = 0;
          uVar10 = 0;
          dVar18 = 0.0;
          do {
            dVar20 = *(double *)((long)local_98 + lVar2);
            if (lVar2 == 0) {
              uVar8 = SUB84(dVar20,0);
              uVar10 = (undefined4)((ulong)dVar20 >> 0x20);
              dVar20 = dVar18;
            }
            lVar2 = lVar2 + -8;
            dVar18 = dVar20;
          } while (lVar2 != -8);
          uVar3 = 0;
          lVar2 = -1;
          uVar6 = 0;
          do {
            if (lVar2 == 0) {
              uVar6 = x & 0xffffffff;
            }
            else {
              uVar3 = y & 0xffffffff;
            }
            lVar2 = lVar2 + 1;
          } while (lVar2 != 1);
          P.x = (double)(int)uVar6;
          P.y = (double)(int)uVar3;
          A.x._4_4_ = uVar11;
          A.x._0_4_ = uVar9;
          A.y = dVar12;
          B.x._4_4_ = uVar16;
          B.x._0_4_ = uVar14;
          B.y = dVar17;
          C.x._4_4_ = uVar10;
          C.x._0_4_ = uVar8;
          C.y = dVar20;
          barycentric(&local_b0,A,B,C,P);
          dVar17 = (double)CONCAT44(local_b0.x._4_4_,local_b0.x._0_4_);
          dVar18 = (double)CONCAT44(local_b0.y._4_4_,local_b0.y._0_4_);
          dVar12 = (local_c8 * local_b0.z + local_b8 * dVar17 + local_c0 * dVar18) /
                   (local_118 * local_b0.z + local_108 * dVar17 + local_110 * dVar18) + 0.5;
          if (255.0 <= dVar12) {
            dVar12 = 255.0;
          }
          if (((0.0 <= dVar17) && (0.0 <= dVar18)) && (0.0 <= local_b0.z)) {
            if (dVar12 <= 0.0) {
              dVar12 = 0.0;
            }
            if (((zbuffer->data).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[zbuffer->width * x + y] <= dVar12) &&
               (local_d0 = dVar12,
               iVar1 = (*local_d8->_vptr_IShader[3])(local_d8,local_e0,&local_124),
               (char)iVar1 == '\0')) {
              (zbuffer->data).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[zbuffer->width * x + y] = local_d0;
              TGAImage::set(local_e8,x,y,&local_124);
            }
          }
          y = y + 1;
          dVar12 = local_108;
          dVar17 = local_110;
          dVar18 = local_118;
        } while ((int)(double)CONCAT44(uVar15,uVar13) + 1U != (int)y);
      }
      x = x + 1;
    } while (local_11c != (int)x);
  }
  return;
}

Assistant:

void triangle(Model &model, std::array<vec4f, 3> pts, IShader &shader, TGAImage &image,
              DepthBuffer &zbuffer)
{
    vec2f bboxmin(std::numeric_limits<double>::max(), std::numeric_limits<double>::max());
    vec2f bboxmax(-std::numeric_limits<double>::max(), -std::numeric_limits<double>::max());
    for (int i = 0; i < 3; i++) {
        for (int j = 0; j < 2; j++) {
            bboxmin[j] = std::min(bboxmin[j], pts[i][j] / pts[i][3]);
            bboxmax[j] = std::max(bboxmax[j], pts[i][j] / pts[i][3]);
        }
    }
    vec2i P;
    TGAColor color;
    for (P.x = static_cast<int>(bboxmin.x); P.x <= static_cast<int>(bboxmax.x); P.x++) {
        for (P.y = static_cast<int>(bboxmin.y); P.y <= static_cast<int>(bboxmax.y); P.y++) {
            vec3f c = barycentric(proj<2, 4>(pts[0] / pts[0][3]), proj<2, 4>(pts[1] / pts[1][3]),
                                  proj<2, 4>(pts[2] / pts[2][3]), to_f(proj<2, 2>(P)));
            double z = pts[0][2] * c.x + pts[1][2] * c.y + pts[2][2] * c.z;
            double w = pts[0][3] * c.x + pts[1][3] * c.y + pts[2][3] * c.z;
            double frag_depth = std::max(0., std::min(255., z / w + .5));
            if (c.x < 0 || c.y < 0 || c.z < 0 || zbuffer.get(P.x, P.y) > frag_depth) continue;
            bool discard = shader.fragment(model, c, color);
            if (!discard) {
                zbuffer.set(P.x, P.y, frag_depth);
                image.set(P.x, P.y, color);
            }
        }
    }
}